

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.cpp
# Opt level: O1

bool __thiscall mpt::buffer::skip(buffer *this,size_t len)

{
  buffer *__dest;
  type_traits *ptVar1;
  ulong uVar2;
  _func_void_void_ptr *p_Var3;
  bool bVar4;
  size_t i;
  ulong uVar5;
  size_t __n;
  
  __n = this->_used - len;
  if (this->_used < len) {
LAB_0012aae4:
    bVar4 = false;
  }
  else {
    __dest = this + 1;
    ptVar1 = this->_content_traits;
    if (ptVar1 != (type_traits *)0x0) {
      uVar2 = ptVar1->size;
      if (uVar2 == 0) goto LAB_0012aae4;
      if (len % uVar2 != 0) {
        return false;
      }
      p_Var3 = ptVar1->fini;
      if (len != 0 && p_Var3 != (_func_void_void_ptr *)0x0) {
        uVar5 = 0;
        do {
          (*p_Var3)((void *)((long)&__dest->_vptr_buffer + uVar5));
          uVar5 = uVar5 + uVar2;
        } while (uVar5 < len);
      }
    }
    memmove(__dest,(void *)((long)&__dest->_vptr_buffer + len),__n);
    this->_used = __n;
    bVar4 = true;
  }
  return bVar4;
}

Assistant:

bool buffer::skip(size_t len)
{
	if (_used < len) {
		return false;
	}
	size_t post = _used - len;
	uint8_t *base = static_cast<uint8_t *>(static_cast<void *>(this + 1));
	const struct type_traits *traits;
	if ((traits = content_traits())) {
		size_t size;
		if (!(size = traits->size)
		 || len % size) {
			return false;
		}
		void (*fini)(void *);
		if ((fini = traits->fini)) {
			for (size_t i = 0; i < len; i += size) {
				fini(base + i);
			}
		}
	}
	std::memmove(base, base + len, post);
	_used = post;
	return true;
}